

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void __thiscall ncnn::Mat::substract_mean_normalize(Mat *this,float *mean_vals,float *norm_vals)

{
  float fVar1;
  float fVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  long lVar8;
  float *pfVar9;
  int iVar10;
  
  iVar7 = this->h * this->w;
  if (norm_vals == (float *)0x0 && mean_vals != (float *)0x0) {
    iVar3 = this->c;
    if (0 < (long)iVar3) {
      pvVar4 = this->data;
      sVar5 = this->cstep;
      sVar6 = this->elemsize;
      lVar8 = 0;
      do {
        if (0 < iVar7) {
          fVar1 = mean_vals[lVar8];
          pfVar9 = (float *)(sVar5 * sVar6 * lVar8 + (long)pvVar4);
          iVar10 = iVar7 + 1;
          do {
            *pfVar9 = *pfVar9 - fVar1;
            pfVar9 = pfVar9 + 1;
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar3);
    }
  }
  else if (mean_vals == (float *)0x0 && norm_vals != (float *)0x0) {
    iVar3 = this->c;
    if (0 < (long)iVar3) {
      pvVar4 = this->data;
      sVar5 = this->cstep;
      sVar6 = this->elemsize;
      lVar8 = 0;
      do {
        if (0 < iVar7) {
          fVar1 = norm_vals[lVar8];
          pfVar9 = (float *)(sVar5 * sVar6 * lVar8 + (long)pvVar4);
          iVar10 = iVar7 + 1;
          do {
            *pfVar9 = *pfVar9 * fVar1;
            pfVar9 = pfVar9 + 1;
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != iVar3);
    }
  }
  else if ((mean_vals != (float *)0x0 && norm_vals != (float *)0x0) &&
          (iVar3 = this->c, 0 < (long)iVar3)) {
    pvVar4 = this->data;
    sVar5 = this->cstep;
    sVar6 = this->elemsize;
    lVar8 = 0;
    do {
      if (0 < iVar7) {
        fVar1 = mean_vals[lVar8];
        fVar2 = norm_vals[lVar8];
        pfVar9 = (float *)(sVar5 * sVar6 * lVar8 + (long)pvVar4);
        iVar10 = iVar7 + 1;
        do {
          *pfVar9 = (*pfVar9 - fVar1) * fVar2;
          pfVar9 = pfVar9 + 1;
          iVar10 = iVar10 + -1;
        } while (1 < iVar10);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar3);
  }
  return;
}

Assistant:

void Mat::substract_mean_normalize(const float* mean_vals, const float* norm_vals)
{
    int size = w * h;

    if (mean_vals && !norm_vals)
    {
        // substract mean only
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float mean = mean_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fsub       v0.4s, v0.4s, v1.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean)     // %4
                : "cc", "memory", "v0", "v1"
            );
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vsub.f32   q0, q0, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean)     // %4
                : "cc", "memory", "q0", "q1"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr -= mean;
                ptr++;
            }
        }
    }
    else if (!mean_vals && norm_vals)
    {
        // normalize only
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float norm = norm_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fmul       v0.4s, v0.4s, v1.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(norm)     // %4
                : "cc", "memory", "v0", "v1"
            );
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vmul.f32   q0, q0, q1          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(norm)     // %4
                : "cc", "memory", "q0", "q1"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr *= norm;
                ptr++;
            }
        }
    }
    else if (mean_vals && norm_vals)
    {
        // substract mean and normalize
        #pragma omp parallel for
        for (int q=0; q<c; q++)
        {
            float* ptr = channel(q);//data + cstep * q;
            const float mean = mean_vals[q];
            const float norm = norm_vals[q];

#if __ARM_NEON
            int nn = size >> 2;
            int remain = size - (nn << 2);
#else
            int remain = size;
#endif // __ARM_NEON

#if __ARM_NEON
#if __aarch64__
            if (nn > 0)
            {
            asm volatile(
                "dup        v1.4s, %w4            \n"
                "dup        v2.4s, %w5            \n"
                "0:                               \n"
                "prfm       pldl1keep, [%1, #128] \n"
                "ld1        {v0.4s}, [%1]         \n"
                "fsub       v0.4s, v0.4s, v1.4s   \n"
                "fmul       v0.4s, v0.4s, v2.4s   \n"
                "subs       %w0, %w0, #1          \n"
                "st1        {v0.4s}, [%1], #16    \n"
                "bne        0b                    \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean),    // %4
                  "r"(norm)     // %5
                : "cc", "memory", "v0", "v1", "v2"
            );  
            }
#else
            if (nn > 0)
            {
            asm volatile(
                "vdup.f32   q1, %4              \n"
                "vdup.f32   q2, %5              \n"
                "0:                             \n"
                "pld        [%1, #128]          \n"
                "vld1.f32   {d0-d1}, [%1 :128]  \n"
                "vsub.f32   q0, q0, q1          \n"
                "vmul.f32   q0, q0, q2          \n"
                "subs       %0, #1              \n"
                "vst1.f32   {d0-d1}, [%1 :128]! \n"
                "bne        0b                  \n"
                : "=r"(nn),     // %0
                  "=r"(ptr)     // %1
                : "0"(nn),
                  "1"(ptr),
                  "r"(mean),    // %4
                  "r"(norm)     // %5
                : "cc", "memory", "q0", "q1", "q2"
            );
            }
#endif // __aarch64__
#endif // __ARM_NEON
            for (; remain>0; remain--)
            {
                *ptr = (*ptr - mean) * norm;
                ptr++;
            }
        }
    }
}